

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_8,_257,_true,_embree::avx::VirtualCurveIntersectorK<8>,_true>::
     intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
               RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Scene *pSVar5;
  long lVar6;
  RayQueryContext *pRVar7;
  uint uVar8;
  ulong uVar9;
  RayQueryContext *pRVar10;
  Scene *pSVar11;
  ulong uVar12;
  ulong uVar13;
  size_t sVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  vint4 ai;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  vint4 ai_3;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  vint4 ai_1;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  vint4 bi_1;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  vint4 bi_3;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  vint4 bi;
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  float fVar40;
  undefined1 auVar41 [16];
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar42 [64];
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar49 [64];
  float fVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar57;
  float fVar58;
  float fVar59;
  undefined1 auVar56 [64];
  float fVar60;
  undefined1 auVar61 [16];
  float fVar63;
  float fVar64;
  float fVar65;
  undefined1 auVar62 [64];
  float fVar66;
  undefined1 auVar67 [16];
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar68 [64];
  float fVar72;
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar73 [64];
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  Intersectors *local_1068;
  size_t local_1060;
  Precalculations *local_1058;
  RayHitK<8> *local_1050;
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined1 local_f88 [16];
  undefined1 local_f78 [3912];
  
  local_1058 = pre;
  local_1068 = This;
  pRVar10 = (RayQueryContext *)(local_f78 + 0x10);
  local_f78._0_8_ = root.ptr;
  local_f78._8_4_ = 0;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_f88._4_4_ = uVar1;
  local_f88._0_4_ = uVar1;
  local_f88._8_4_ = uVar1;
  local_f88._12_4_ = uVar1;
  auVar73 = ZEXT1664(local_f88);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_fd8._4_4_ = uVar1;
  local_fd8._0_4_ = uVar1;
  local_fd8._8_4_ = uVar1;
  local_fd8._12_4_ = uVar1;
  auVar62 = ZEXT1664(local_fd8);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_fe8._4_4_ = uVar1;
  local_fe8._0_4_ = uVar1;
  local_fe8._8_4_ = uVar1;
  local_fe8._12_4_ = uVar1;
  auVar68 = ZEXT1664(local_fe8);
  local_f98 = *(float *)((long)&(tray->dir).field_0 + k * 4);
  fStack_f94 = local_f98;
  fStack_f90 = local_f98;
  fStack_f8c = local_f98;
  local_fa8 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fStack_fa4 = local_fa8;
  fStack_fa0 = local_fa8;
  fStack_f9c = local_fa8;
  local_fb8 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x40);
  fStack_fb4 = local_fb8;
  fStack_fb0 = local_fb8;
  fStack_fac = local_fb8;
  fVar40 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar43 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar44 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar16 = ZEXT416((uint)(fVar40 * 0.99999964));
  local_ff8 = vshufps_avx(auVar16,auVar16,0);
  auVar37 = ZEXT1664(local_ff8);
  auVar16 = ZEXT416((uint)(fVar43 * 0.99999964));
  local_1008 = vshufps_avx(auVar16,auVar16,0);
  auVar38 = ZEXT1664(local_1008);
  auVar16 = ZEXT416((uint)(fVar44 * 0.99999964));
  local_1018 = vshufps_avx(auVar16,auVar16,0);
  auVar39 = ZEXT1664(local_1018);
  auVar16 = ZEXT416((uint)(fVar40 * 1.0000004));
  local_1028 = vshufps_avx(auVar16,auVar16,0);
  auVar42 = ZEXT1664(local_1028);
  auVar16 = ZEXT416((uint)(fVar43 * 1.0000004));
  local_1038 = vshufps_avx(auVar16,auVar16,0);
  auVar49 = ZEXT1664(local_1038);
  auVar16 = ZEXT416((uint)(fVar44 * 1.0000004));
  local_1048 = vshufps_avx(auVar16,auVar16,0);
  auVar56 = ZEXT1664(local_1048);
  uVar13 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar15 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar9 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar2 = (tray->tnear).field_0.i[k];
  local_1078._4_4_ = iVar2;
  local_1078._0_4_ = iVar2;
  local_1078._8_4_ = iVar2;
  local_1078._12_4_ = iVar2;
  auVar36 = ZEXT1664(local_1078);
  iVar2 = (tray->tfar).field_0.i[k];
  auVar17 = ZEXT1664(CONCAT412(iVar2,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))));
  local_1050 = ray;
  local_1060 = k;
  sVar14 = k;
LAB_00f8f6ac:
  do {
    if (pRVar10 == (RayQueryContext *)local_f78) {
      return;
    }
    pRVar7 = pRVar10 + -1;
    pRVar10 = (RayQueryContext *)&pRVar10[-1].user;
  } while (*(float *)(ray + sVar14 * 4 + 0x100) < *(float *)&pRVar7->args);
  pSVar11 = *(Scene **)pRVar10;
LAB_00f8f6d6:
  if (((ulong)pSVar11 & 0xf) == 0) {
    auVar16 = vsubps_avx(*(undefined1 (*) [16])
                          ((long)&(pSVar11->super_AccelN).super_Accel.super_AccelData.bounds.bounds0
                                  .upper.field_0 + uVar13),auVar73._0_16_);
    auVar18._0_4_ = auVar37._0_4_ * auVar16._0_4_;
    auVar18._4_4_ = auVar37._4_4_ * auVar16._4_4_;
    auVar18._8_4_ = auVar37._8_4_ * auVar16._8_4_;
    auVar18._12_4_ = auVar37._12_4_ * auVar16._12_4_;
    auVar16 = vsubps_avx(*(undefined1 (*) [16])
                          ((long)&(pSVar11->super_AccelN).super_Accel.super_AccelData.bounds.bounds0
                                  .upper.field_0 + uVar15),auVar62._0_16_);
    auVar23._0_4_ = auVar38._0_4_ * auVar16._0_4_;
    auVar23._4_4_ = auVar38._4_4_ * auVar16._4_4_;
    auVar23._8_4_ = auVar38._8_4_ * auVar16._8_4_;
    auVar23._12_4_ = auVar38._12_4_ * auVar16._12_4_;
    auVar16 = vmaxps_avx(auVar18,auVar23);
    auVar54 = vsubps_avx(*(undefined1 (*) [16])
                          ((long)&(pSVar11->super_AccelN).super_Accel.super_AccelData.bounds.bounds0
                                  .upper.field_0 + uVar9),auVar68._0_16_);
    auVar24._0_4_ = auVar39._0_4_ * auVar54._0_4_;
    auVar24._4_4_ = auVar39._4_4_ * auVar54._4_4_;
    auVar24._8_4_ = auVar39._8_4_ * auVar54._8_4_;
    auVar24._12_4_ = auVar39._12_4_ * auVar54._12_4_;
    auVar54 = vsubps_avx(*(undefined1 (*) [16])
                          ((long)&(pSVar11->super_AccelN).super_Accel.super_AccelData.bounds.bounds0
                                  .upper.field_0 + (uVar13 ^ 0x10)),auVar73._0_16_);
    auVar27._0_4_ = auVar42._0_4_ * auVar54._0_4_;
    auVar27._4_4_ = auVar42._4_4_ * auVar54._4_4_;
    auVar27._8_4_ = auVar42._8_4_ * auVar54._8_4_;
    auVar27._12_4_ = auVar42._12_4_ * auVar54._12_4_;
    auVar54 = vsubps_avx(*(undefined1 (*) [16])
                          ((long)&(pSVar11->super_AccelN).super_Accel.super_AccelData.bounds.bounds0
                                  .upper.field_0 + (uVar15 ^ 0x10)),auVar62._0_16_);
    auVar30._0_4_ = auVar49._0_4_ * auVar54._0_4_;
    auVar30._4_4_ = auVar49._4_4_ * auVar54._4_4_;
    auVar30._8_4_ = auVar49._8_4_ * auVar54._8_4_;
    auVar30._12_4_ = auVar49._12_4_ * auVar54._12_4_;
    auVar21 = vminps_avx(auVar27,auVar30);
    auVar54 = vsubps_avx(*(undefined1 (*) [16])
                          ((long)&(pSVar11->super_AccelN).super_Accel.super_AccelData.bounds.bounds0
                                  .upper.field_0 + (uVar9 ^ 0x10)),auVar68._0_16_);
    auVar31._0_4_ = auVar56._0_4_ * auVar54._0_4_;
    auVar31._4_4_ = auVar56._4_4_ * auVar54._4_4_;
    auVar31._8_4_ = auVar56._8_4_ * auVar54._8_4_;
    auVar31._12_4_ = auVar56._12_4_ * auVar54._12_4_;
    auVar54 = vmaxps_avx(auVar24,auVar36._0_16_);
    local_1088 = vmaxps_avx(auVar16,auVar54);
    auVar16 = vminps_avx(auVar31,auVar17._0_16_);
    auVar16 = vminps_avx(auVar21,auVar16);
    auVar16 = vcmpps_avx(local_1088,auVar16,2);
    uVar8 = vmovmskps_avx(auVar16);
  }
  else {
    if ((int)((ulong)pSVar11 & 0xf) != 2) {
      k = (size_t)context;
      (**(code **)((long)local_1068->leafIntersector +
                  (ulong)*(byte *)((ulong)pSVar11 & 0xfffffffffffffff0) * 0x40 + 0x20))
                (local_1058,ray,sVar14,context);
      auVar73 = ZEXT1664(local_f88);
      uVar1 = *(undefined4 *)(local_1050 + local_1060 * 4 + 0x100);
      auVar17 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
      auVar62 = ZEXT1664(local_fd8);
      auVar68 = ZEXT1664(local_fe8);
      auVar37 = ZEXT1664(local_ff8);
      auVar38 = ZEXT1664(local_1008);
      auVar39 = ZEXT1664(local_1018);
      auVar42 = ZEXT1664(local_1028);
      auVar49 = ZEXT1664(local_1038);
      auVar56 = ZEXT1664(local_1048);
      auVar36 = ZEXT1664(local_1078);
      ray = local_1050;
      sVar14 = local_1060;
      goto LAB_00f8f6ac;
    }
    uVar12 = (ulong)pSVar11 & 0xfffffffffffffff0;
    local_fc8 = *(float *)(uVar12 + 0x40);
    fStack_fc4 = *(float *)(uVar12 + 0x44);
    fStack_fc0 = *(float *)(uVar12 + 0x48);
    fStack_fbc = *(float *)(uVar12 + 0x4c);
    auVar54._0_4_ =
         local_fb8 * *(float *)(uVar12 + 0x80) + local_fa8 * *(float *)(uVar12 + 0x50) +
         local_f98 * *(float *)(uVar12 + 0x20);
    auVar54._4_4_ =
         fStack_fb4 * *(float *)(uVar12 + 0x84) + fStack_fa4 * *(float *)(uVar12 + 0x54) +
         fStack_f94 * *(float *)(uVar12 + 0x24);
    auVar54._8_4_ =
         fStack_fb0 * *(float *)(uVar12 + 0x88) + fStack_fa0 * *(float *)(uVar12 + 0x58) +
         fStack_f90 * *(float *)(uVar12 + 0x28);
    auVar54._12_4_ =
         fStack_fac * *(float *)(uVar12 + 0x8c) + fStack_f9c * *(float *)(uVar12 + 0x5c) +
         fStack_f8c * *(float *)(uVar12 + 0x2c);
    auVar41._0_4_ =
         local_fb8 * *(float *)(uVar12 + 0x90) + local_fa8 * *(float *)(uVar12 + 0x60) +
         local_f98 * *(float *)(uVar12 + 0x30);
    auVar41._4_4_ =
         fStack_fb4 * *(float *)(uVar12 + 0x94) + fStack_fa4 * *(float *)(uVar12 + 100) +
         fStack_f94 * *(float *)(uVar12 + 0x34);
    auVar41._8_4_ =
         fStack_fb0 * *(float *)(uVar12 + 0x98) + fStack_fa0 * *(float *)(uVar12 + 0x68) +
         fStack_f90 * *(float *)(uVar12 + 0x38);
    auVar41._12_4_ =
         fStack_fac * *(float *)(uVar12 + 0x9c) + fStack_f9c * *(float *)(uVar12 + 0x6c) +
         fStack_f8c * *(float *)(uVar12 + 0x3c);
    auVar47._0_4_ =
         local_fb8 * *(float *)(uVar12 + 0xa0) + local_fa8 * *(float *)(uVar12 + 0x70) +
         local_f98 * local_fc8;
    auVar47._4_4_ =
         fStack_fb4 * *(float *)(uVar12 + 0xa4) + fStack_fa4 * *(float *)(uVar12 + 0x74) +
         fStack_f94 * fStack_fc4;
    auVar47._8_4_ =
         fStack_fb0 * *(float *)(uVar12 + 0xa8) + fStack_fa0 * *(float *)(uVar12 + 0x78) +
         fStack_f90 * fStack_fc0;
    auVar47._12_4_ =
         fStack_fac * *(float *)(uVar12 + 0xac) + fStack_f9c * *(float *)(uVar12 + 0x7c) +
         fStack_f8c * fStack_fbc;
    auVar67._8_4_ = 0x7fffffff;
    auVar67._0_8_ = 0x7fffffff7fffffff;
    auVar67._12_4_ = 0x7fffffff;
    auVar16 = vandps_avx(auVar54,auVar67);
    auVar19._8_4_ = 0x219392ef;
    auVar19._0_8_ = 0x219392ef219392ef;
    auVar19._12_4_ = 0x219392ef;
    auVar16 = vcmpps_avx(auVar16,auVar19,1);
    auVar54 = vblendvps_avx(auVar54,auVar19,auVar16);
    auVar16 = vandps_avx(auVar41,auVar67);
    auVar16 = vcmpps_avx(auVar16,auVar19,1);
    auVar21 = vblendvps_avx(auVar41,auVar19,auVar16);
    auVar16 = vandps_avx(auVar47,auVar67);
    auVar16 = vcmpps_avx(auVar16,auVar19,1);
    auVar16 = vblendvps_avx(auVar47,auVar19,auVar16);
    auVar19 = vrcpps_avx(auVar54);
    fVar40 = auVar19._0_4_;
    auVar48._0_4_ = fVar40 * auVar54._0_4_;
    fVar43 = auVar19._4_4_;
    auVar48._4_4_ = fVar43 * auVar54._4_4_;
    fVar44 = auVar19._8_4_;
    auVar48._8_4_ = fVar44 * auVar54._8_4_;
    fVar45 = auVar19._12_4_;
    auVar48._12_4_ = fVar45 * auVar54._12_4_;
    auVar20._8_4_ = 0x3f800000;
    auVar20._0_8_ = 0x3f8000003f800000;
    auVar20._12_4_ = 0x3f800000;
    auVar54 = vsubps_avx(auVar20,auVar48);
    fVar40 = fVar40 + fVar40 * auVar54._0_4_;
    fVar43 = fVar43 + fVar43 * auVar54._4_4_;
    fVar44 = fVar44 + fVar44 * auVar54._8_4_;
    fVar45 = fVar45 + fVar45 * auVar54._12_4_;
    auVar54 = vrcpps_avx(auVar21);
    fVar46 = auVar54._0_4_;
    auVar55._0_4_ = fVar46 * auVar21._0_4_;
    fVar50 = auVar54._4_4_;
    auVar55._4_4_ = fVar50 * auVar21._4_4_;
    fVar51 = auVar54._8_4_;
    auVar55._8_4_ = fVar51 * auVar21._8_4_;
    fVar52 = auVar54._12_4_;
    auVar55._12_4_ = fVar52 * auVar21._12_4_;
    auVar54 = vsubps_avx(auVar20,auVar55);
    fVar46 = fVar46 + fVar46 * auVar54._0_4_;
    fVar50 = fVar50 + fVar50 * auVar54._4_4_;
    fVar51 = fVar51 + fVar51 * auVar54._8_4_;
    fVar52 = fVar52 + fVar52 * auVar54._12_4_;
    auVar54 = vrcpps_avx(auVar16);
    fVar53 = auVar54._0_4_;
    auVar61._0_4_ = fVar53 * auVar16._0_4_;
    fVar57 = auVar54._4_4_;
    auVar61._4_4_ = fVar57 * auVar16._4_4_;
    fVar58 = auVar54._8_4_;
    auVar61._8_4_ = fVar58 * auVar16._8_4_;
    fVar59 = auVar54._12_4_;
    auVar61._12_4_ = fVar59 * auVar16._12_4_;
    auVar16 = vsubps_avx(auVar20,auVar61);
    fVar53 = fVar53 + fVar53 * auVar16._0_4_;
    fVar57 = fVar57 + fVar57 * auVar16._4_4_;
    fVar58 = fVar58 + fVar58 * auVar16._8_4_;
    fVar59 = fVar59 + fVar59 * auVar16._12_4_;
    auVar68 = ZEXT1664(local_fe8);
    fVar66 = local_fe8._0_4_;
    fVar69 = local_fe8._4_4_;
    fVar70 = local_fe8._8_4_;
    fVar71 = local_fe8._12_4_;
    auVar62 = ZEXT1664(local_fd8);
    fVar60 = local_fd8._0_4_;
    fVar63 = local_fd8._4_4_;
    fVar64 = local_fd8._8_4_;
    fVar65 = local_fd8._12_4_;
    fVar72 = auVar73._0_4_;
    fVar74 = auVar73._4_4_;
    fVar75 = auVar73._8_4_;
    fVar76 = auVar73._12_4_;
    auVar28._0_4_ =
         (fVar72 * *(float *)(uVar12 + 0x20) +
         fVar60 * *(float *)(uVar12 + 0x50) +
         fVar66 * *(float *)(uVar12 + 0x80) + *(float *)(uVar12 + 0xb0)) * -fVar40;
    auVar28._4_4_ =
         (fVar74 * *(float *)(uVar12 + 0x24) +
         fVar63 * *(float *)(uVar12 + 0x54) +
         fVar69 * *(float *)(uVar12 + 0x84) + *(float *)(uVar12 + 0xb4)) * -fVar43;
    auVar28._8_4_ =
         (fVar75 * *(float *)(uVar12 + 0x28) +
         fVar64 * *(float *)(uVar12 + 0x58) +
         fVar70 * *(float *)(uVar12 + 0x88) + *(float *)(uVar12 + 0xb8)) * -fVar44;
    auVar28._12_4_ =
         (fVar76 * *(float *)(uVar12 + 0x2c) +
         fVar65 * *(float *)(uVar12 + 0x5c) +
         fVar71 * *(float *)(uVar12 + 0x8c) + *(float *)(uVar12 + 0xbc)) * -fVar45;
    auVar25._0_4_ =
         (fVar72 * *(float *)(uVar12 + 0x30) +
         fVar60 * *(float *)(uVar12 + 0x60) +
         fVar66 * *(float *)(uVar12 + 0x90) + *(float *)(uVar12 + 0xc0)) * -fVar46;
    auVar25._4_4_ =
         (fVar74 * *(float *)(uVar12 + 0x34) +
         fVar63 * *(float *)(uVar12 + 100) +
         fVar69 * *(float *)(uVar12 + 0x94) + *(float *)(uVar12 + 0xc4)) * -fVar50;
    auVar25._8_4_ =
         (fVar75 * *(float *)(uVar12 + 0x38) +
         fVar64 * *(float *)(uVar12 + 0x68) +
         fVar70 * *(float *)(uVar12 + 0x98) + *(float *)(uVar12 + 200)) * -fVar51;
    auVar25._12_4_ =
         (fVar76 * *(float *)(uVar12 + 0x3c) +
         fVar65 * *(float *)(uVar12 + 0x6c) +
         fVar71 * *(float *)(uVar12 + 0x9c) + *(float *)(uVar12 + 0xcc)) * -fVar52;
    auVar21._0_4_ =
         (fVar72 * local_fc8 +
         fVar60 * *(float *)(uVar12 + 0x70) +
         fVar66 * *(float *)(uVar12 + 0xa0) + *(float *)(uVar12 + 0xd0)) * -fVar53;
    auVar21._4_4_ =
         (fVar74 * fStack_fc4 +
         fVar63 * *(float *)(uVar12 + 0x74) +
         fVar69 * *(float *)(uVar12 + 0xa4) + *(float *)(uVar12 + 0xd4)) * -fVar57;
    auVar21._8_4_ =
         (fVar75 * fStack_fc0 +
         fVar64 * *(float *)(uVar12 + 0x78) +
         fVar70 * *(float *)(uVar12 + 0xa8) + *(float *)(uVar12 + 0xd8)) * -fVar58;
    auVar21._12_4_ =
         (fVar76 * fStack_fbc +
         fVar65 * *(float *)(uVar12 + 0x7c) +
         fVar71 * *(float *)(uVar12 + 0xac) + *(float *)(uVar12 + 0xdc)) * -fVar59;
    auVar32._0_4_ = fVar40 + auVar28._0_4_;
    auVar32._4_4_ = fVar43 + auVar28._4_4_;
    auVar32._8_4_ = fVar44 + auVar28._8_4_;
    auVar32._12_4_ = fVar45 + auVar28._12_4_;
    auVar33._0_4_ = fVar46 + auVar25._0_4_;
    auVar33._4_4_ = fVar50 + auVar25._4_4_;
    auVar33._8_4_ = fVar51 + auVar25._8_4_;
    auVar33._12_4_ = fVar52 + auVar25._12_4_;
    auVar35._0_4_ = fVar53 + auVar21._0_4_;
    auVar35._4_4_ = fVar57 + auVar21._4_4_;
    auVar35._8_4_ = fVar58 + auVar21._8_4_;
    auVar35._12_4_ = fVar59 + auVar21._12_4_;
    auVar16 = vpminsd_avx(auVar25,auVar33);
    auVar54 = vpminsd_avx(auVar21,auVar35);
    auVar16 = vmaxps_avx(auVar16,auVar54);
    auVar20 = vpminsd_avx(auVar28,auVar32);
    auVar19 = vpmaxsd_avx(auVar28,auVar32);
    auVar54 = vpmaxsd_avx(auVar25,auVar33);
    auVar21 = vpmaxsd_avx(auVar21,auVar35);
    auVar21 = vminps_avx(auVar54,auVar21);
    auVar36 = ZEXT1664(local_1078);
    auVar54 = vmaxps_avx(local_1078,auVar20);
    auVar16 = vmaxps_avx(auVar54,auVar16);
    auVar54 = vminps_avx(auVar17._0_16_,auVar19);
    auVar54 = vminps_avx(auVar54,auVar21);
    local_1088._0_4_ = auVar16._0_4_ * 0.99999964;
    local_1088._4_4_ = auVar16._4_4_ * 0.99999964;
    local_1088._8_4_ = auVar16._8_4_ * 0.99999964;
    local_1088._12_4_ = auVar16._12_4_ * 0.99999964;
    auVar16._0_4_ = auVar54._0_4_ * 1.0000004;
    auVar16._4_4_ = auVar54._4_4_ * 1.0000004;
    auVar16._8_4_ = auVar54._8_4_ * 1.0000004;
    auVar16._12_4_ = auVar54._12_4_ * 1.0000004;
    auVar16 = vcmpps_avx(local_1088,auVar16,2);
    uVar8 = vmovmskps_avx(auVar16);
    auVar37 = ZEXT1664(local_ff8);
    auVar38 = ZEXT1664(local_1008);
    auVar39 = ZEXT1664(local_1018);
    auVar42 = ZEXT1664(local_1028);
    auVar49 = ZEXT1664(local_1038);
    auVar56 = ZEXT1664(local_1048);
  }
  k = CONCAT44((int)(k >> 0x20),uVar8);
  if ((RayQueryContext *)k == (RayQueryContext *)0x0) goto LAB_00f8f6ac;
  uVar12 = (ulong)pSVar11 & 0xfffffffffffffff0;
  lVar6 = 0;
  if ((RayQueryContext *)k != (RayQueryContext *)0x0) {
    for (; (k >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
    }
  }
  pSVar11 = *(Scene **)(uVar12 + lVar6 * 8);
  uVar8 = uVar8 - 1 & uVar8;
  k = (size_t)pRVar10;
  if (uVar8 != 0) {
    uVar3 = *(uint *)(local_1088 + lVar6 * 4);
    lVar6 = 0;
    if (uVar8 != 0) {
      for (; (uVar8 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
      }
    }
    pSVar5 = *(Scene **)(uVar12 + lVar6 * 8);
    uVar4 = *(uint *)(local_1088 + lVar6 * 4);
    uVar8 = uVar8 - 1 & uVar8;
    if (uVar8 == 0) {
      k = (size_t)&pRVar10->args;
      if (uVar3 < uVar4) {
        pRVar10->scene = pSVar5;
        *(uint *)&pRVar10->user = uVar4;
        pRVar10 = (RayQueryContext *)k;
      }
      else {
        pRVar10->scene = pSVar11;
        *(uint *)&pRVar10->user = uVar3;
        pRVar10 = (RayQueryContext *)k;
        pSVar11 = pSVar5;
      }
    }
    else {
      auVar22._8_8_ = 0;
      auVar22._0_8_ = pSVar11;
      auVar16 = vpunpcklqdq_avx(auVar22,ZEXT416(uVar3));
      auVar26._8_8_ = 0;
      auVar26._0_8_ = pSVar5;
      auVar54 = vpunpcklqdq_avx(auVar26,ZEXT416(uVar4));
      lVar6 = 0;
      if (uVar8 != 0) {
        for (; (uVar8 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
        }
      }
      auVar29._8_8_ = 0;
      auVar29._0_8_ = *(ulong *)(uVar12 + lVar6 * 8);
      auVar19 = vpunpcklqdq_avx(auVar29,ZEXT416(*(uint *)(local_1088 + lVar6 * 4)));
      auVar21 = vpcmpgtd_avx(auVar54,auVar16);
      uVar8 = uVar8 - 1 & uVar8;
      if (uVar8 == 0) {
        auVar20 = vpshufd_avx(auVar21,0xaa);
        auVar21 = vblendvps_avx(auVar54,auVar16,auVar20);
        auVar16 = vblendvps_avx(auVar16,auVar54,auVar20);
        auVar54 = vpcmpgtd_avx(auVar19,auVar21);
        auVar20 = vpshufd_avx(auVar54,0xaa);
        auVar54 = vblendvps_avx(auVar19,auVar21,auVar20);
        auVar21 = vblendvps_avx(auVar21,auVar19,auVar20);
        auVar19 = vpcmpgtd_avx(auVar21,auVar16);
        auVar20 = vpshufd_avx(auVar19,0xaa);
        auVar19 = vblendvps_avx(auVar21,auVar16,auVar20);
        auVar16 = vblendvps_avx(auVar16,auVar21,auVar20);
        pRVar10->scene = (Scene *)auVar16._0_8_;
        pRVar10->user = (RTCRayQueryContext *)auVar16._8_8_;
        *(undefined1 (*) [16])&pRVar10->args = auVar19;
        pSVar11 = auVar54._0_8_;
        pRVar10 = (RayQueryContext *)&pRVar10[1].user;
        k = (size_t)pRVar10;
      }
      else {
        lVar6 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
          }
        }
        auVar34._8_8_ = 0;
        auVar34._0_8_ = *(ulong *)(uVar12 + lVar6 * 8);
        auVar25 = vpunpcklqdq_avx(auVar34,ZEXT416(*(uint *)(local_1088 + lVar6 * 4)));
        auVar20 = vpshufd_avx(auVar21,0xaa);
        auVar21 = vblendvps_avx(auVar54,auVar16,auVar20);
        auVar16 = vblendvps_avx(auVar16,auVar54,auVar20);
        auVar54 = vpcmpgtd_avx(auVar25,auVar19);
        auVar20 = vpshufd_avx(auVar54,0xaa);
        auVar54 = vblendvps_avx(auVar25,auVar19,auVar20);
        auVar19 = vblendvps_avx(auVar19,auVar25,auVar20);
        auVar20 = vpcmpgtd_avx(auVar19,auVar16);
        auVar25 = vpshufd_avx(auVar20,0xaa);
        auVar20 = vblendvps_avx(auVar19,auVar16,auVar25);
        auVar16 = vblendvps_avx(auVar16,auVar19,auVar25);
        auVar19 = vpcmpgtd_avx(auVar54,auVar21);
        auVar25 = vpshufd_avx(auVar19,0xaa);
        auVar19 = vblendvps_avx(auVar54,auVar21,auVar25);
        auVar54 = vblendvps_avx(auVar21,auVar54,auVar25);
        auVar21 = vpcmpgtd_avx(auVar20,auVar54);
        auVar25 = vpshufd_avx(auVar21,0xaa);
        auVar21 = vblendvps_avx(auVar20,auVar54,auVar25);
        auVar54 = vblendvps_avx(auVar54,auVar20,auVar25);
        pRVar10->scene = (Scene *)auVar16._0_8_;
        pRVar10->user = (RTCRayQueryContext *)auVar16._8_8_;
        *(undefined1 (*) [16])&pRVar10->args = auVar54;
        pRVar10[1].user = (RTCRayQueryContext *)auVar21._0_8_;
        pRVar10[1].args = (RTCIntersectArguments *)auVar21._8_8_;
        auVar36 = ZEXT1664(local_1078);
        pSVar11 = auVar19._0_8_;
        pRVar10 = pRVar10 + 2;
        k = (size_t)pRVar10;
      }
    }
  }
  goto LAB_00f8f6d6;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }